

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printBankedRegOperand(MCInst *MI,uint OpNum,SStream *O)

{
  MCOperand *op;
  int64_t iVar1;
  char *s;
  uint in_ESI;
  MCInst *in_RDI;
  char *Name;
  arm_sysreg RegIds [32];
  char *RegNames [32];
  uint32_t SysM;
  uint32_t R;
  uint32_t Banked;
  char *in_stack_fffffffffffffe48;
  SStream *ss;
  arm_sysreg local_1a8 [32];
  undefined8 local_128 [32];
  uint local_24;
  uint local_20;
  uint local_1c;
  MCInst *local_8;
  
  local_8 = in_RDI;
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar1 = MCOperand_getImm(op);
  local_1c = (uint)iVar1;
  local_20 = (local_1c & 0x20) >> 5;
  local_24 = local_1c & 0x1f;
  memcpy(local_128,&PTR_anon_var_dwarf_234a33_0093b4e0,0x100);
  memcpy(local_1a8,&DAT_005f6d20,0x80);
  ss = (SStream *)local_128[local_24];
  if (local_20 == 0) {
    SStream_concat0(ss,in_stack_fffffffffffffe48);
    ARM_addSysReg(local_8,local_1a8[local_24]);
  }
  else {
    SStream_concat0(ss,in_stack_fffffffffffffe48);
    s = (char *)(ulong)(local_24 - 0xe);
    switch(s) {
    default:
    case (char *)0x0:
      SStream_concat0(ss,s);
      ARM_addSysReg(local_8,ARM_SYSREG_SPSR_FIQ);
      break;
    case (char *)0x2:
      SStream_concat0(ss,s);
      ARM_addSysReg(local_8,ARM_SYSREG_SPSR_IRQ);
      break;
    case (char *)0x4:
      SStream_concat0(ss,s);
      ARM_addSysReg(local_8,ARM_SYSREG_SPSR_SVC);
      break;
    case (char *)0x6:
      SStream_concat0(ss,s);
      ARM_addSysReg(local_8,ARM_SYSREG_SPSR_ABT);
      break;
    case (char *)0x8:
      SStream_concat0(ss,s);
      ARM_addSysReg(local_8,ARM_SYSREG_SPSR_UND);
      break;
    case (char *)0xe:
      SStream_concat0(ss,s);
      ARM_addSysReg(local_8,ARM_SYSREG_SPSR_MON);
      break;
    case (char *)0x10:
      SStream_concat0(ss,s);
      ARM_addSysReg(local_8,ARM_SYSREG_SPSR_HYP);
    }
  }
  return;
}

Assistant:

static void printBankedRegOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	uint32_t Banked = (uint32_t)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	uint32_t R = (Banked & 0x20) >> 5;
	uint32_t SysM = Banked & 0x1f;
	const char *RegNames[] = {
		"r8_usr", "r9_usr", "r10_usr", "r11_usr", "r12_usr", "sp_usr", "lr_usr", "",
		"r8_fiq", "r9_fiq", "r10_fiq", "r11_fiq", "r12_fiq", "sp_fiq", "lr_fiq", "",
		"lr_irq", "sp_irq", "lr_svc",  "sp_svc",  "lr_abt",  "sp_abt", "lr_und", "sp_und",
		"",       "",       "",        "",        "lr_mon",  "sp_mon", "elr_hyp", "sp_hyp"
	};
	arm_sysreg RegIds[] = {
		ARM_SYSREG_R8_USR, ARM_SYSREG_R9_USR, ARM_SYSREG_R10_USR,
		ARM_SYSREG_R11_USR, ARM_SYSREG_R12_USR, ARM_SYSREG_SP_USR,
		ARM_SYSREG_LR_USR, 0, ARM_SYSREG_R8_FIQ, ARM_SYSREG_R9_FIQ,
		ARM_SYSREG_R10_FIQ, ARM_SYSREG_R11_FIQ, ARM_SYSREG_R12_FIQ,
		ARM_SYSREG_SP_FIQ, ARM_SYSREG_LR_FIQ, 0, ARM_SYSREG_LR_IRQ,
		ARM_SYSREG_SP_IRQ, ARM_SYSREG_LR_SVC, ARM_SYSREG_SP_SVC,
		ARM_SYSREG_LR_ABT, ARM_SYSREG_SP_ABT, ARM_SYSREG_LR_UND,
		ARM_SYSREG_SP_UND, 0, 0, 0, 0, ARM_SYSREG_LR_MON, ARM_SYSREG_SP_MON,
		ARM_SYSREG_ELR_HYP, ARM_SYSREG_SP_HYP,
	};
	const char *Name = RegNames[SysM];

	// Nothing much we can do about this, the encodings are specified in B9.2.3 of
	// the ARM ARM v7C, and are all over the shop.
	if (R) {
		SStream_concat0(O, "SPSR_");

		switch(SysM) {
			default: // llvm_unreachable("Invalid banked SPSR register");
			case 0x0e: SStream_concat0(O, "fiq"); ARM_addSysReg(MI, ARM_SYSREG_SPSR_FIQ); return;
			case 0x10: SStream_concat0(O, "irq"); ARM_addSysReg(MI, ARM_SYSREG_SPSR_IRQ); return;
			case 0x12: SStream_concat0(O, "svc"); ARM_addSysReg(MI, ARM_SYSREG_SPSR_SVC); return;
			case 0x14: SStream_concat0(O, "abt"); ARM_addSysReg(MI, ARM_SYSREG_SPSR_ABT); return;
			case 0x16: SStream_concat0(O, "und"); ARM_addSysReg(MI, ARM_SYSREG_SPSR_UND); return;
			case 0x1c: SStream_concat0(O, "mon"); ARM_addSysReg(MI, ARM_SYSREG_SPSR_MON); return;
			case 0x1e: SStream_concat0(O, "hyp"); ARM_addSysReg(MI, ARM_SYSREG_SPSR_HYP); return;
		}
	}

	//assert(!R && "should have dealt with SPSR regs");
	//assert(Name[0] && "invalid banked register operand");

	SStream_concat0(O, Name);
	ARM_addSysReg(MI, RegIds[SysM]);
}